

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib508.c
# Opt level: O1

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  if ((size * nmemb != 0) && (*(long *)((long)userp + 8) != 0)) {
    *(undefined1 *)ptr = **userp;
    *(long *)userp = *userp + 1;
    *(long *)((long)userp + 8) = *(long *)((long)userp + 8) + -1;
    return 1;
  }
  return 0;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;

  if(size*nmemb < 1)
    return 0;

  if(pooh->sizeleft) {
    *(char *)ptr = pooh->readptr[0]; /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    pooh->sizeleft--;                /* less data left */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
}